

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O3

EVaction INT_REVassoc_bridge_action
                   (CMConnection conn,EVstone stone,attr_list contact_list,EVstone remote_stone)

{
  int condition;
  CMFormat format;
  EV_int_response response;
  int local_50;
  EVstone local_4c;
  void *local_48;
  undefined8 local_40;
  undefined1 local_38 [4];
  EVaction local_34;
  
  local_40 = 0;
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EVassoc_bridge_action_req_formats);
  local_4c = stone;
  local_48 = (void *)attr_list_to_string(contact_list);
  local_40 = CONCAT44(local_40._4_4_,remote_stone);
  local_50 = condition;
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EVassoc_bridge_action_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,local_38);
  INT_CMwrite(conn,format,&local_50);
  free(local_48);
  INT_CMCondition_wait(conn->cm,condition);
  return local_34;
}

Assistant:

extern EVaction
INT_REVassoc_bridge_action(CMConnection conn, EVstone stone, attr_list contact_list, EVstone remote_stone)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVassoc_bridge_action_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVassoc_bridge_action_req_formats);
    request.stone = stone;
    request.contact_list = attr_list_to_string(contact_list);
    request.remote_stone = remote_stone;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVassoc_bridge_action_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    free(request.contact_list);
    INT_CMCondition_wait(conn->cm, cond);
    return (EVaction) response.ret;
}